

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QString * QFileSystemEngine::tempPath(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QArrayDataPointer<char16_t> QStack_58;
  QDir local_40;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((QString *)&local_38,"TMPDIR");
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    other.m_data = "/tmp/";
    other.m_size = 5;
    QString::operator=((QString *)&local_38,other);
  }
  QDir::cleanPath((QString *)&QStack_58,(QString *)&local_38);
  QDir::QDir(&local_40,(QString *)&QStack_58);
  QDir::canonicalPath(in_RDI,&local_40);
  QDir::~QDir(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEngine::tempPath()
{
#ifdef QT_UNIX_TEMP_PATH_OVERRIDE
    return QT_UNIX_TEMP_PATH_OVERRIDE ""_L1;
#else
    QString temp = qEnvironmentVariable("TMPDIR");
    if (temp.isEmpty()) {
        if (false) {
#if defined(Q_OS_DARWIN) && !defined(QT_BOOTSTRAPPED)
        } else if (NSString *nsPath = NSTemporaryDirectory()) {
            temp = QString::fromCFString((CFStringRef)nsPath);
#endif
        } else {
            temp = _PATH_TMP ""_L1;
        }
    }
    return QDir(QDir::cleanPath(temp)).canonicalPath();
#endif
}